

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e550::BasicLoggerTimeFixture::canonicalize_sign(BasicLoggerTimeFixture *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  char *message;
  AssertHelper local_48 [3];
  Message local_30;
  char local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  BasicLoggerTimeFixture *this_local;
  
  local_21 = '\0';
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  pvVar3 = std::array<char,_25UL>::operator[](&this->buffer_,0x18);
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((EqHelper *)local_20,"\'\\0\'","buffer_[pstore::basic_logger::time_buffer_size - 1]",
             &local_21,pvVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_basic_logger.cpp"
               ,0x89,message);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (bVar1) {
    pvVar3 = std::array<char,_25UL>::operator[](&this->buffer_,0x13);
    iVar2 = strcmp(pvVar3,"+0000");
    if (iVar2 == 0) {
      pvVar3 = std::array<char,_25UL>::operator[](&this->buffer_,0x13);
      *pvVar3 = '-';
    }
  }
  return;
}

Assistant:

void BasicLoggerTimeFixture::canonicalize_sign () {
        static_assert (pstore::basic_logger::time_buffer_size >= sign_index_,
                       "sign index is too large for time_buffer");
        ASSERT_EQ ('\0', buffer_[pstore::basic_logger::time_buffer_size - 1]);
        if (std::strcmp (&buffer_[sign_index_], "+0000") == 0) {
            buffer_[sign_index_] = '-';
        }
    }